

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context_id.cpp
# Opt level: O0

bool anon_unknown.dwarf_abb8b::open_map
               (char *filename,
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               *cmap,Iconv *iconv)

{
  char *pcVar1;
  bool bVar2;
  ostream *poVar3;
  istream *piVar4;
  size_t sVar5;
  long in_RDX;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int> *in_RSI
  ;
  char *in_RDI;
  __enable_if_t<is_constructible<value_type,_pair<basic_string<char>,_int>_>::value,_pair<iterator,_bool>_>
  _Var6;
  string pos;
  string line;
  char *col [2];
  ifstream ifs;
  undefined7 in_stack_fffffffffffffc60;
  undefined1 in_stack_fffffffffffffc67;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
  in_stack_fffffffffffffc68;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int> *this;
  ostream *in_stack_fffffffffffffc88;
  ostream *in_stack_fffffffffffffc90;
  ostream *in_stack_fffffffffffffc98;
  ostream *in_stack_fffffffffffffca0;
  allocator local_291;
  string local_290 [38];
  byte local_26a;
  die local_269;
  string local_268 [32];
  char *local_248;
  char *local_240;
  byte local_22e;
  die local_22d [13];
  long local_220 [65];
  long local_18;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  *local_10;
  char *local_8;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  std::ifstream::ifstream(local_220,in_RDI,_S_in);
  local_22e = 0;
  bVar2 = std::ios::operator_cast_to_bool
                    ((ios *)((long)local_220 + *(long *)(local_220[0] + -0x18)));
  if (!bVar2) {
    MeCab::die::die(local_22d);
    local_22e = 1;
    poVar3 = std::operator<<((ostream *)&std::cerr,
                             "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/context_id.cpp"
                            );
    poVar3 = std::operator<<(poVar3,"(");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x13);
    poVar3 = std::operator<<(poVar3,") [");
    poVar3 = std::operator<<(poVar3,"ifs");
    poVar3 = std::operator<<(poVar3,"] ");
    poVar3 = std::operator<<(poVar3,"no such file or directory: ");
    poVar3 = std::operator<<(poVar3,local_8);
    MeCab::die::operator&(local_22d,poVar3);
  }
  if ((local_22e & 1) != 0) {
    MeCab::die::~die((die *)0x1650bc);
  }
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::clear((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           *)0x1650c9);
  std::__cxx11::string::string(local_268);
  while( true ) {
    piVar4 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)local_220,local_268);
    bVar2 = std::ios::operator_cast_to_bool((ios *)(piVar4 + *(long *)(*(long *)piVar4 + -0x18)));
    if (!bVar2) break;
    std::__cxx11::string::c_str();
    local_26a = 0;
    sVar5 = MeCab::tokenize2<char**>
                      ((char *)in_stack_fffffffffffffca0,(char *)in_stack_fffffffffffffc98,
                       (char **)in_stack_fffffffffffffc90,(size_t)in_stack_fffffffffffffc88);
    if (sVar5 != 2) {
      MeCab::die::die(&local_269);
      local_26a = 1;
      poVar3 = std::operator<<((ostream *)&std::cerr,
                               "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/context_id.cpp"
                              );
      poVar3 = std::operator<<(poVar3,"(");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x19);
      poVar3 = std::operator<<(poVar3,") [");
      in_stack_fffffffffffffca0 =
           std::operator<<(poVar3,
                           "2 == tokenize2(const_cast<char *>(line.c_str()), \" \\t\", col, 2)");
      in_stack_fffffffffffffc98 = std::operator<<(in_stack_fffffffffffffca0,"] ");
      in_stack_fffffffffffffc90 = std::operator<<(in_stack_fffffffffffffc98,"format error: ");
      in_stack_fffffffffffffc88 = std::operator<<(in_stack_fffffffffffffc90,local_268);
      MeCab::die::operator&(&local_269,in_stack_fffffffffffffc88);
    }
    if ((local_26a & 1) != 0) {
      MeCab::die::~die((die *)0x165272);
    }
    pcVar1 = local_240;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_290,pcVar1,&local_291);
    std::allocator<char>::~allocator((allocator<char> *)&local_291);
    if (local_18 != 0) {
      MeCab::Iconv::convert
                ((Iconv *)in_stack_fffffffffffffc68._M_node,
                 (string *)CONCAT17(in_stack_fffffffffffffc67,in_stack_fffffffffffffc60));
    }
    this = local_10;
    atoi(local_248);
    std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
    ::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_true>
              (this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    in_stack_fffffffffffffc68._M_node,
               (int *)CONCAT17(in_stack_fffffffffffffc67,in_stack_fffffffffffffc60));
    _Var6 = std::
            map<std::__cxx11::string,int,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
            ::insert<std::pair<std::__cxx11::string,int>>
                      ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                        *)this,(pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
                                *)in_stack_fffffffffffffc68._M_node);
    in_stack_fffffffffffffc68 = _Var6.first._M_node;
    in_stack_fffffffffffffc67 = _Var6.second;
    std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
    ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
             *)0x165439);
    std::__cxx11::string::~string(local_290);
  }
  std::__cxx11::string::~string(local_268);
  std::ifstream::~ifstream(local_220);
  return true;
}

Assistant:

bool open_map(const char *filename,
              std::map<std::string, int> *cmap,
              Iconv *iconv) {
  std::ifstream ifs(WPATH(filename));
  CHECK_DIE(ifs) << "no such file or directory: " << filename;
  cmap->clear();
  char *col[2];
  std::string line;
  while (std::getline(ifs, line)) {
    CHECK_DIE(2 == tokenize2(const_cast<char *>(line.c_str()),
                             " \t", col, 2))
        << "format error: " << line;
    std::string pos = col[1];
    if (iconv) {
      iconv->convert(&pos);
    }
    cmap->insert(std::pair<std::string, int>
                 (pos, std::atoi(col[0])));
  }
  return true;
}